

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlOutputBufferWriteEscape
              (xmlOutputBufferPtr out,xmlChar *str,xmlCharEncodingOutputFunc escaping)

{
  code *pcVar1;
  undefined8 uVar2;
  xmlCharEncodingOutputFunc p_Var3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  xmlBufPtr pxVar7;
  xmlChar *pxVar8;
  bool local_81;
  int local_54;
  int local_44;
  int local_40;
  int cons;
  int len;
  int chunk;
  int oldwritten;
  int written;
  int ret;
  int nbchars;
  xmlCharEncodingOutputFunc escaping_local;
  xmlChar *str_local;
  xmlOutputBufferPtr out_local;
  
  written = 0;
  chunk = 0;
  len = 0;
  if ((((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) || (str == (xmlChar *)0x0)) ||
     ((out->buffer == (xmlBufPtr)0x0 ||
      (_ret = escaping, escaping_local = (xmlCharEncodingOutputFunc)str, str_local = (xmlChar *)out,
      iVar4 = xmlBufGetAllocationScheme(out->buffer), iVar4 == 2)))) {
    out_local._4_4_ = -1;
  }
  else {
    sVar5 = strlen((char *)escaping_local);
    local_40 = (int)sVar5;
    if (local_40 < 0) {
      out_local._4_4_ = 0;
    }
    else if (*(int *)(str_local + 0x34) == 0) {
      if (_ret == (xmlCharEncodingOutputFunc)0x0) {
        _ret = xmlEscapeContent;
      }
      do {
        len = chunk;
        local_44 = local_40;
        sVar6 = xmlBufAvail(*(xmlBufPtr *)(str_local + 0x20));
        p_Var3 = _ret;
        cons = (int)sVar6;
        if (cons < 0x28) {
          iVar4 = xmlBufGrow(*(xmlBufPtr *)(str_local + 0x20),100);
          if (iVar4 < 0) {
            return -1;
          }
          len = -1;
        }
        else {
          if (*(long *)(str_local + 0x18) == 0) {
            pxVar8 = xmlBufEnd(*(xmlBufPtr *)(str_local + 0x20));
            oldwritten = (*p_Var3)(pxVar8,&cons,(uchar *)escaping_local,&local_44);
            if ((oldwritten < 0) || (cons == 0)) {
              return -1;
            }
            xmlBufAddLen(*(xmlBufPtr *)(str_local + 0x20),(long)cons);
            if (*(long *)(str_local + 8) == 0) {
              written = cons;
            }
            else {
              sVar6 = xmlBufUse(*(xmlBufPtr *)(str_local + 0x20));
              written = (int)sVar6;
            }
          }
          else {
            if (*(long *)(str_local + 0x28) == 0) {
              pxVar7 = xmlBufCreate();
              *(xmlBufPtr *)(str_local + 0x28) = pxVar7;
            }
            p_Var3 = _ret;
            pxVar8 = xmlBufEnd(*(xmlBufPtr *)(str_local + 0x20));
            oldwritten = (*p_Var3)(pxVar8,&cons,(uchar *)escaping_local,&local_44);
            if ((oldwritten < 0) || (cons == 0)) {
              return -1;
            }
            xmlBufAddLen(*(xmlBufPtr *)(str_local + 0x20),(long)cons);
            sVar6 = xmlBufUse(*(xmlBufPtr *)(str_local + 0x20));
            if ((sVar6 < 4000) && (local_44 == local_40)) break;
            oldwritten = xmlCharEncOutput((xmlOutputBufferPtr)str_local,0);
            if ((oldwritten < 0) && (oldwritten != -3)) {
              xmlIOErr(0x608,(char *)0x0);
              str_local[0x34] = '\b';
              str_local[0x35] = '\x06';
              str_local[0x36] = '\0';
              str_local[0x37] = '\0';
              return -1;
            }
            if (*(long *)(str_local + 8) == 0) {
              local_54 = oldwritten;
              if (oldwritten < 0) {
                local_54 = 0;
              }
              written = local_54;
            }
            else {
              sVar6 = xmlBufUse(*(xmlBufPtr *)(str_local + 0x28));
              written = (int)sVar6;
            }
          }
          escaping_local = escaping_local + local_44;
          local_40 = local_40 - local_44;
          if (*(long *)(str_local + 8) == 0) {
            sVar6 = xmlBufAvail(*(xmlBufPtr *)(str_local + 0x20));
            if (sVar6 < 4000) {
              xmlBufGrow(*(xmlBufPtr *)(str_local + 0x20),4000);
            }
          }
          else {
            if ((written < 4000) && (local_40 < 1)) break;
            if (*(long *)(str_local + 0x18) == 0) {
              pcVar1 = *(code **)(str_local + 8);
              uVar2 = *(undefined8 *)str_local;
              pxVar8 = xmlBufContent(*(xmlBuf **)(str_local + 0x20));
              oldwritten = (*pcVar1)(uVar2,pxVar8,written);
              if (-1 < oldwritten) {
                xmlBufShrink(*(xmlBufPtr *)(str_local + 0x20),(long)oldwritten);
              }
            }
            else {
              pcVar1 = *(code **)(str_local + 8);
              uVar2 = *(undefined8 *)str_local;
              pxVar8 = xmlBufContent(*(xmlBuf **)(str_local + 0x28));
              oldwritten = (*pcVar1)(uVar2,pxVar8,written);
              if (-1 < oldwritten) {
                xmlBufShrink(*(xmlBufPtr *)(str_local + 0x28),(long)oldwritten);
              }
            }
            if (oldwritten < 0) {
              xmlIOErr(0x60a,(char *)0x0);
              str_local[0x34] = '\n';
              str_local[0x35] = '\x06';
              str_local[0x36] = '\0';
              str_local[0x37] = '\0';
              return oldwritten;
            }
            if (0x7fffffff - oldwritten < *(int *)(str_local + 0x30)) {
              str_local[0x30] = 0xff;
              str_local[0x31] = 0xff;
              str_local[0x32] = 0xff;
              str_local[0x33] = '\x7f';
            }
            else {
              *(int *)(str_local + 0x30) = oldwritten + *(int *)(str_local + 0x30);
            }
          }
          chunk = written + chunk;
        }
        local_81 = 0 < local_40 && len != chunk;
      } while (local_81);
      out_local._4_4_ = chunk;
    }
    else {
      out_local._4_4_ = -1;
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlOutputBufferWriteEscape(xmlOutputBufferPtr out, const xmlChar *str,
                           xmlCharEncodingOutputFunc escaping) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int oldwritten=0;/* loop guard */
    int chunk;       /* number of byte currently processed from str */
    int len;         /* number of bytes in str */
    int cons;        /* byte from str consumed */

    if ((out == NULL) || (out->error) || (str == NULL) ||
        (out->buffer == NULL) ||
	(xmlBufGetAllocationScheme(out->buffer) == XML_BUFFER_ALLOC_IMMUTABLE))
        return(-1);
    len = strlen((const char *)str);
    if (len < 0) return(0);
    if (out->error) return(-1);
    if (escaping == NULL) escaping = xmlEscapeContent;

    do {
        oldwritten = written;

        /*
	 * how many bytes to consume and how many bytes to store.
	 */
	cons = len;
	chunk = xmlBufAvail(out->buffer);

        /*
	 * make sure we have enough room to save first, if this is
	 * not the case force a flush, but make sure we stay in the loop
	 */
	if (chunk < 40) {
	    if (xmlBufGrow(out->buffer, 100) < 0)
	        return(-1);
            oldwritten = -1;
	    continue;
	}

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = escaping(xmlBufEnd(out->buffer) ,
	                   &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (cons == len))
		goto done;

	    /*
	     * convert as much as possible to the output buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            if (out->writecallback)
	        nbchars = xmlBufUse(out->conv);
            else
                nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = escaping(xmlBufEnd(out->buffer), &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);
            if (out->writecallback)
	        nbchars = xmlBufUse(out->buffer);
            else
                nbchars = chunk;
	}
	str += cons;
	len -= cons;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	} else if (xmlBufAvail(out->buffer) < MINLEN) {
	    xmlBufGrow(out->buffer, MINLEN);
	}
	written += nbchars;
    } while ((len > 0) && (oldwritten != written));

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}